

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O0

void __thiscall
kj::StringTree::StringTree(StringTree *this,Array<kj::StringTree> *pieces,StringPtr delim)

{
  size_t sVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree *pSVar4;
  char *pcVar5;
  char *__src;
  uint local_54;
  undefined1 local_50 [4];
  uint i;
  Array<kj::StringTree> *local_28;
  Array<kj::StringTree> *pieces_local;
  StringTree *this_local;
  StringPtr delim_local;
  
  delim_local.content.ptr = (char *)delim.content.size_;
  this_local = (StringTree *)delim.content.ptr;
  this->size_ = 0;
  local_28 = pieces;
  pieces_local = (Array<kj::StringTree> *)this;
  String::String(&this->text);
  sVar1 = Array<kj::StringTree>::size(local_28);
  heapArray<kj::StringTree::Branch>(&this->branches,sVar1);
  sVar1 = Array<kj::StringTree>::size(local_28);
  if (sVar1 != 0) {
    sVar1 = Array<kj::StringTree>::size(local_28);
    if ((1 < sVar1) && (sVar1 = StringPtr::size((StringPtr *)&this_local), sVar1 != 0)) {
      sVar1 = Array<kj::StringTree>::size(local_28);
      sVar2 = StringPtr::size((StringPtr *)&this_local);
      heapString((String *)local_50,(sVar1 - 1) * sVar2);
      String::operator=(&this->text,(String *)local_50);
      String::~String((String *)local_50);
      sVar1 = String::size(&this->text);
      this->size_ = sVar1;
    }
    pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,0);
    pBVar3->index = 0;
    pSVar4 = Array<kj::StringTree>::operator[](local_28,0);
    pSVar4 = mv<kj::StringTree>(pSVar4);
    pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,0);
    operator=(&pBVar3->content,pSVar4);
    pSVar4 = Array<kj::StringTree>::operator[](local_28,0);
    sVar1 = size(pSVar4);
    this->size_ = sVar1 + this->size_;
    for (local_54 = 1; sVar1 = Array<kj::StringTree>::size(local_28), local_54 < sVar1;
        local_54 = local_54 + 1) {
      sVar1 = StringPtr::size((StringPtr *)&this_local);
      if (sVar1 != 0) {
        pcVar5 = String::begin(&this->text);
        sVar1 = StringPtr::size((StringPtr *)&this_local);
        __src = StringPtr::begin((StringPtr *)&this_local);
        sVar2 = StringPtr::size((StringPtr *)&this_local);
        memcpy(pcVar5 + (local_54 - 1) * sVar1,__src,sVar2);
      }
      sVar1 = StringPtr::size((StringPtr *)&this_local);
      pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(ulong)local_54);
      pBVar3->index = local_54 * sVar1;
      pSVar4 = Array<kj::StringTree>::operator[](local_28,(ulong)local_54);
      pSVar4 = mv<kj::StringTree>(pSVar4);
      pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(ulong)local_54);
      operator=(&pBVar3->content,pSVar4);
      pSVar4 = Array<kj::StringTree>::operator[](local_28,(ulong)local_54);
      sVar1 = size(pSVar4);
      this->size_ = sVar1 + this->size_;
    }
  }
  return;
}

Assistant:

StringTree::StringTree(Array<StringTree>&& pieces, StringPtr delim)
    : size_(0),
      branches(heapArray<Branch>(pieces.size())) {
  if (pieces.size() > 0) {
    if (pieces.size() > 1 && delim.size() > 0) {
      text = heapString((pieces.size() - 1) * delim.size());
      size_ = text.size();
    }

    branches[0].index = 0;
    branches[0].content = kj::mv(pieces[0]);
    size_ += pieces[0].size();

    for (uint i = 1; i < pieces.size(); i++) {
      if (delim.size() > 0) {
        memcpy(text.begin() + (i - 1) * delim.size(), delim.begin(), delim.size());
      }
      branches[i].index = i * delim.size();
      branches[i].content = kj::mv(pieces[i]);
      size_ += pieces[i].size();
    }
  }
}